

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::Type::isDefaultable(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  byte local_51;
  Type local_48;
  Type t;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  Type *this_local;
  
  bVar1 = isTuple(this);
  if (bVar1) {
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)begin(this);
    _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)end(this);
    while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                             ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &__end2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      *)&t), bVar1) {
      pTVar2 = Iterator::operator*((Iterator *)
                                   &__end2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
      local_48.id = pTVar2->id;
      bVar1 = isDefaultable(&local_48);
      if (!bVar1) {
        return false;
      }
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
    this_local._7_1_ = true;
  }
  else {
    bVar1 = isConcrete(this);
    local_51 = 0;
    if (bVar1) {
      bVar1 = isNonNullable(this);
      local_51 = bVar1 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_51 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Type::isDefaultable() const {
  // A variable can get a default value if its type is concrete (unreachable
  // and none have no values, hence no default), and if it's a reference, it
  // must be nullable.
  if (isTuple()) {
    for (auto t : *this) {
      if (!t.isDefaultable()) {
        return false;
      }
    }
    return true;
  }
  return isConcrete() && !isNonNullable();
}